

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O1

UChar * icu_63::TimeZone::dereferOlsonLink(UnicodeString *id)

{
  int32_t iVar1;
  UResType UVar2;
  UResourceBundle *resB;
  UResourceBundle *array;
  UChar *pUVar3;
  UChar *pUVar4;
  UErrorCode ec;
  UErrorCode local_2c;
  
  local_2c = U_ZERO_ERROR;
  resB = ures_openDirect_63((char *)0x0,"zoneinfo64",&local_2c);
  array = ures_getByKey_63(resB,"Names",(UResourceBundle *)0x0,&local_2c);
  iVar1 = findInStringArray(array,id,&local_2c);
  pUVar3 = ures_getStringByIndex_63(array,iVar1,(int32_t *)0x0,&local_2c);
  ures_getByKey_63(resB,"Zones",resB,&local_2c);
  ures_getByIndex_63(resB,iVar1,resB,&local_2c);
  if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar2 = ures_getType_63(resB);
    if (UVar2 == RES_INT) {
      iVar1 = ures_getInt_63(resB,&local_2c);
      pUVar4 = ures_getStringByIndex_63(array,iVar1,(int32_t *)0x0,&local_2c);
      if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
        pUVar3 = pUVar4;
      }
    }
  }
  ures_close_63(array);
  ures_close_63(resB);
  return pUVar3;
}

Assistant:

const UChar*
TimeZone::dereferOlsonLink(const UnicodeString& id) {
    const UChar *result = NULL;
    UErrorCode ec = U_ZERO_ERROR;
    UResourceBundle *rb = ures_openDirect(NULL, kZONEINFO, &ec);

    // resolve zone index by name
    UResourceBundle *names = ures_getByKey(rb, kNAMES, NULL, &ec);
    int32_t idx = findInStringArray(names, id, ec);
    result = ures_getStringByIndex(names, idx, NULL, &ec);

    // open the zone bundle by index
    ures_getByKey(rb, kZONES, rb, &ec);
    ures_getByIndex(rb, idx, rb, &ec); 

    if (U_SUCCESS(ec)) {
        if (ures_getType(rb) == URES_INT) {
            // this is a link - dereference the link
            int32_t deref = ures_getInt(rb, &ec);
            const UChar* tmp = ures_getStringByIndex(names, deref, NULL, &ec);
            if (U_SUCCESS(ec)) {
                result = tmp;
            }
        }
    }

    ures_close(names);
    ures_close(rb);

    return result;
}